

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::DescriptorTest_RegressionNamesAreNullTerminated_Test::
~DescriptorTest_RegressionNamesAreNullTerminated_Test
          (DescriptorTest_RegressionNamesAreNullTerminated_Test *this)

{
  DescriptorTest::~DescriptorTest(&this->super_DescriptorTest);
  operator_delete(this,0x118);
  return;
}

Assistant:

TEST_F(DescriptorTest, RegressionNamesAreNullTerminated) {
  // Name accessors where migrated from std::string to absl::string_view.
  // Some callers were taking the C-String out of the std::string via `.data()`
  // and that code kept working when the type was changed.
  // We want to keep that working for now to prevent breaking these users
  // dynamically.
  const auto check_nul_terminated = [](absl::string_view view) {
    EXPECT_EQ(view.data()[view.size()], '\0');
  };
  const auto check_nul_names = [&](auto* entity) {
    check_nul_terminated(entity->name());
    check_nul_terminated(entity->full_name());
  };

  const auto check_nul_field_names = [&](auto* field) {
    check_nul_terminated(field->name());
    check_nul_terminated(field->full_name());
    check_nul_terminated(field->lowercase_name());
    check_nul_terminated(field->camelcase_name());
    check_nul_terminated(field->json_name());
  };

  check_nul_names(message4_);
  check_nul_names(enum_);
  for (int i = 0; i < message4_->field_count(); ++i) {
    check_nul_field_names(message4_->field(i));
  }
}